

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Reshape_x86::forward(Reshape_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long *plVar7;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  bool bVar8;
  __m128 _v;
  int i_2;
  float *outptr_2;
  float *ptr;
  int q_1;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 _row3_1;
  __m128 _row2_1;
  __m128 _row1_1;
  __m128 _row0_1;
  int i_1;
  float *outptr_1;
  float *ptr3_1;
  float *ptr2_1;
  float *ptr1_1;
  float *ptr0_1;
  int q;
  int size;
  Option opt_flatten_1;
  Mat bottom_blob_flattened_1;
  size_t out_elemsize_1;
  int out_elempack_2;
  int _c;
  int _d;
  int _h_1;
  int _w_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _row3;
  __m128 _row2;
  __m128 _row1;
  __m128 _row0;
  int j;
  float *outptr;
  float *ptr3;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int i;
  int outh;
  int outw;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  size_t out_elemsize;
  int out_elempack_1;
  int _h;
  int _w;
  int total;
  size_t elemsize;
  int dims;
  int dims_1;
  int out_elempack;
  int ret;
  Mat top_blob_unpacked;
  Mat bottom_blob_unpacked;
  Option opt_pack;
  int elempack;
  Mat *m_1;
  Mat *m;
  size_t in_stack_fffffffffffff058;
  Allocator *in_stack_fffffffffffff060;
  void **ppvVar9;
  size_t in_stack_fffffffffffff068;
  Mat *in_stack_fffffffffffff070;
  Option *in_stack_fffffffffffff078;
  Mat *in_stack_fffffffffffff080;
  int iVar10;
  Mat *in_stack_fffffffffffff088;
  Mat *in_stack_fffffffffffff090;
  int in_stack_fffffffffffff0d0;
  undefined4 in_stack_fffffffffffff0d8;
  undefined4 in_stack_fffffffffffff0dc;
  undefined4 in_stack_fffffffffffff0e0;
  undefined4 in_stack_fffffffffffff0e4;
  int local_df8;
  int local_df4;
  int local_df0;
  int local_dec;
  int local_de8;
  int local_de4;
  int local_c80;
  int local_c7c;
  int local_c0c;
  undefined8 local_c08;
  undefined8 local_c00;
  undefined8 local_bf8;
  undefined4 local_bf0;
  long local_be8;
  undefined4 local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 local_bd0;
  undefined8 local_bc8;
  undefined8 *local_bc0;
  undefined8 *local_bb8;
  int local_bac;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  int local_b24;
  undefined8 local_b20;
  undefined8 local_b18;
  undefined8 local_b10;
  undefined4 local_b08;
  long local_b00;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined8 local_ae0;
  undefined8 *local_ad8;
  undefined8 *local_ad0;
  undefined8 *local_ac8;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  int local_ab0;
  int local_aac;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  void *local_a60;
  int *local_a58;
  long local_a50;
  undefined4 local_a48;
  long *local_a40;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  int local_a28;
  long local_a20;
  long local_a18;
  int local_a0c;
  int local_a08;
  int local_a04;
  int local_a00;
  int local_9fc;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  int local_974;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 *local_958;
  undefined8 *local_950;
  int local_944;
  int local_940;
  int local_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  void *local_8f8;
  int *local_8f0;
  long local_8e8;
  undefined4 local_8e0;
  long *local_8d8;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  int local_8c0;
  long local_8b8;
  long local_8b0;
  int local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  ulong local_898;
  int local_88c;
  int local_888;
  undefined4 local_884;
  int local_880;
  int local_87c;
  void *local_878;
  int *local_870;
  undefined8 local_868;
  undefined4 local_860;
  long *local_858;
  int local_850;
  int local_84c;
  int local_848;
  undefined4 local_844;
  int local_840;
  undefined8 local_838;
  void *local_820;
  int *local_818;
  undefined8 local_810;
  undefined4 local_808;
  long *local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  int local_794;
  undefined8 *local_790;
  long *local_788;
  long *local_780;
  int local_76c;
  void **local_768;
  void **local_760;
  void **local_758;
  void **local_748;
  void **local_738;
  undefined8 *local_728;
  undefined8 *local_718;
  void **local_708;
  long *local_6f8;
  void **local_6f0;
  long *local_6e8;
  void **local_6e0;
  int local_6c8;
  undefined4 local_6c4;
  long *local_6c0;
  long *local_6b8;
  int local_6a8;
  undefined4 local_6a4;
  long *local_6a0;
  void **local_680;
  long *local_678;
  void **local_670;
  void **local_668;
  void **local_660;
  void **local_658;
  void **local_650;
  void **local_648;
  void **local_640;
  void **local_638;
  void **local_630;
  void **local_628;
  int local_61c;
  long *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  Option *in_stack_fffffffffffffa70;
  undefined4 uVar11;
  Mat *in_stack_fffffffffffffa78;
  undefined4 uVar12;
  Mat *in_stack_fffffffffffffa80;
  undefined4 uVar13;
  Reshape *in_stack_fffffffffffffa88;
  undefined4 uVar14;
  undefined4 local_568;
  undefined4 uStack_564;
  undefined4 local_558;
  undefined4 uStack_554;
  undefined4 uStack_540;
  undefined4 uStack_53c;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  
  local_794 = (int)in_RSI[3];
  local_790 = in_RCX;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1) {
    local_7d8 = *in_RCX;
    local_7c8 = in_RCX[2];
    uStack_7c0 = in_RCX[3];
    local_7b8 = in_RCX[4];
    uStack_7b0 = in_RCX[5];
    local_7a8 = in_RCX[6];
    uStack_7a0 = in_RCX[7];
    uStack_7d0 = in_RCX[2];
    local_768 = &local_820;
    local_820 = (void *)0x0;
    iVar10 = (int)((ulong)in_stack_fffffffffffff080 >> 0x20);
    local_818 = (int *)0x0;
    local_810 = 0;
    local_808 = 0;
    local_800 = (long *)0x0;
    local_7f8 = 0;
    local_7f4 = 0;
    local_7f0 = 0;
    local_7ec = 0;
    local_7e8 = 0;
    local_7e0 = 0;
    convert_packing(in_stack_fffffffffffff090,in_stack_fffffffffffff088,iVar10,
                    in_stack_fffffffffffff078);
    local_760 = &local_878;
    local_878 = (void *)0x0;
    local_870 = (int *)0x0;
    local_868 = 0;
    local_860 = 0;
    local_858 = (long *)0x0;
    local_850 = 0;
    local_84c = 0;
    local_848 = 0;
    local_844 = 0;
    local_840 = 0;
    local_838 = 0;
    local_87c = Reshape::forward(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                                 in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
    local_76c = local_87c;
    if (local_87c == 0) {
      local_884 = 1;
      if ((*(byte *)((long)local_790 + 0x27) & 1) != 0) {
        local_888 = local_850;
        if ((local_850 == 1) && (local_884 = 1, local_84c % 4 == 0)) {
          local_884 = 4;
        }
        if ((local_850 == 2) && (local_884 = 1, local_848 % 4 == 0)) {
          local_884 = 4;
        }
        if (((local_850 == 3) || (local_850 == 4)) && (local_884 = 1, local_840 % 4 == 0)) {
          local_884 = 4;
        }
      }
      convert_packing(in_stack_fffffffffffff090,in_stack_fffffffffffff088,iVar10,
                      in_stack_fffffffffffff078);
      local_76c = 0;
    }
    local_880 = 1;
    local_758 = &local_878;
    if (local_870 != (int *)0x0) {
      LOCK();
      iVar10 = *local_870;
      *local_870 = *local_870 + -1;
      UNLOCK();
      if (iVar10 == 1) {
        if (local_858 == (long *)0x0) {
          if (local_878 != (void *)0x0) {
            free(local_878);
          }
        }
        else {
          (**(code **)(*local_858 + 0x18))(local_858,local_878);
        }
      }
    }
    local_878 = (void *)0x0;
    local_868 = 0;
    local_860 = 0;
    local_844 = 0;
    local_838 = 0;
    local_870 = (int *)0x0;
    local_748 = &local_820;
    if (local_818 != (int *)0x0) {
      LOCK();
      iVar10 = *local_818;
      *local_818 = *local_818 + -1;
      UNLOCK();
      if (iVar10 == 1) {
        if (local_800 == (long *)0x0) {
          if (local_820 != (void *)0x0) {
            free(local_820);
          }
        }
        else {
          (**(code **)(*local_800 + 0x18))(local_800,local_820);
        }
      }
    }
  }
  else {
    local_788 = in_RDX;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1) {
      flatten(in_stack_fffffffffffff090,in_stack_fffffffffffff088,
              (Option *)in_stack_fffffffffffff080);
      bVar8 = true;
      if (*local_788 != 0) {
        bVar8 = local_788[8] * (long)(int)local_788[7] == 0;
      }
      if (bVar8) {
        local_76c = -100;
      }
      else {
        local_76c = 0;
      }
    }
    else {
      local_88c = (int)in_RSI[5];
      local_898 = in_RSI[2];
      local_89c = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
                  (int)in_RSI[7] * local_794;
      local_780 = in_RSI;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2) {
        local_8a0 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_8a4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        if (local_8a0 == 0) {
          if (local_88c == 1) {
            local_c7c = *(int *)((long)in_RSI + 0x2c) * local_794;
          }
          else {
            local_c7c = *(int *)((long)in_RSI + 0x2c);
          }
          local_8a0 = local_c7c;
        }
        if (local_8a4 == 0) {
          if (local_88c == 2) {
            local_c80 = (int)in_RSI[6] * local_794;
          }
          else {
            local_c80 = (int)in_RSI[6];
          }
          local_8a4 = local_c80;
        }
        if (local_8a0 == -1) {
          local_8a0 = local_89c / local_8a4;
        }
        if (local_8a4 == -1) {
          local_8a4 = local_89c / local_8a0;
        }
        local_8a8 = 1;
        if (((*(byte *)((long)in_RCX + 0x27) & 1) != 0) && (local_8a8 = 1, local_8a4 % 4 == 0)) {
          local_8a8 = 4;
        }
        local_8b0 = (local_898 / (ulong)(long)local_794) * (long)local_8a8;
        if (((local_88c == 2) && ((int)in_RSI[6] * local_794 == local_8a4)) &&
           (local_794 == local_8a8)) {
          if (in_RDX != in_RSI) {
            if (in_RSI[1] != 0) {
              piVar1 = (int *)in_RSI[1];
              local_6a4 = 1;
              LOCK();
              local_6a8 = *piVar1;
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            local_6a0 = in_RSI;
            if (in_RDX[1] != 0) {
              piVar1 = (int *)in_RDX[1];
              LOCK();
              iVar10 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (iVar10 == 1) {
                if (in_RDX[4] == 0) {
                  if ((void *)*in_RDX != (void *)0x0) {
                    free((void *)*in_RDX);
                  }
                }
                else {
                  (**(code **)(*(long *)in_RDX[4] + 0x18))
                            ((long *)in_RDX[4],*in_RDX,local_898 % (ulong)(long)local_794);
                }
              }
            }
            *in_RDX = 0;
            in_RDX[2] = 0;
            *(undefined4 *)(in_RDX + 3) = 0;
            *(undefined4 *)(in_RDX + 5) = 0;
            *(undefined4 *)((long)in_RDX + 0x2c) = 0;
            *(undefined4 *)(in_RDX + 6) = 0;
            *(undefined4 *)((long)in_RDX + 0x34) = 0;
            *(undefined4 *)(in_RDX + 7) = 0;
            in_RDX[8] = 0;
            in_RDX[1] = 0;
            *in_RDX = *local_6a0;
            in_RDX[1] = local_6a0[1];
            in_RDX[2] = local_6a0[2];
            *(int *)(in_RDX + 3) = (int)local_6a0[3];
            in_RDX[4] = local_6a0[4];
            *(int *)(in_RDX + 5) = (int)local_6a0[5];
            *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_6a0 + 0x2c);
            *(int *)(in_RDX + 6) = (int)local_6a0[6];
            *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_6a0 + 0x34);
            *(int *)(in_RDX + 7) = (int)local_6a0[7];
            in_RDX[8] = local_6a0[8];
          }
          return 0;
        }
        if (local_8a8 == 1) {
          flatten(in_stack_fffffffffffff090,in_stack_fffffffffffff088,
                  (Option *)in_stack_fffffffffffff080);
          bVar8 = true;
          if (*local_788 != 0) {
            bVar8 = local_788[8] * (long)(int)local_788[7] == 0;
          }
          if (!bVar8) {
            *(undefined4 *)(local_788 + 5) = 2;
            *(int *)((long)local_788 + 0x2c) = local_8a0;
            *(int *)(local_788 + 6) = local_8a4;
            local_788[8] = (long)local_8a0 * (long)local_8a4;
            local_788[2] = local_8b0;
            *(int *)(local_788 + 3) = local_8a8;
            return 0;
          }
          return -100;
        }
        local_680 = &local_8f8;
        local_8f8 = (void *)*in_RSI;
        local_8f0 = (int *)in_RSI[1];
        local_8e8 = in_RSI[2];
        local_8e0 = (undefined4)in_RSI[3];
        local_8d8 = (long *)in_RSI[4];
        local_8d0 = (undefined4)in_RSI[5];
        local_8cc = *(undefined4 *)((long)in_RSI + 0x2c);
        local_8c8 = (undefined4)in_RSI[6];
        local_8c4 = *(undefined4 *)((long)in_RSI + 0x34);
        local_8c0 = (int)in_RSI[7];
        local_8b8 = in_RSI[8];
        if (local_8f0 != (int *)0x0) {
          LOCK();
          *local_8f0 = *local_8f0 + 1;
          UNLOCK();
        }
        local_938 = *in_RCX;
        local_928 = in_RCX[2];
        uStack_920 = in_RCX[3];
        local_918 = in_RCX[4];
        uStack_910 = in_RCX[5];
        local_908 = in_RCX[6];
        uStack_900 = in_RCX[7];
        uStack_930 = in_RCX[2];
        flatten(in_stack_fffffffffffff090,in_stack_fffffffffffff088,
                (Option *)in_stack_fffffffffffff080);
        local_6e0 = &local_8f8;
        if (local_8f8 == (void *)0x0 || local_8b8 * local_8c0 == 0) {
          local_76c = -100;
          local_880 = 1;
        }
        else {
          Mat::create(in_stack_fffffffffffff080,(int)((ulong)in_stack_fffffffffffff078 >> 0x20),
                      (int)in_stack_fffffffffffff078,(size_t)in_stack_fffffffffffff070,
                      (int)(in_stack_fffffffffffff068 >> 0x20),in_stack_fffffffffffff060);
          local_6e8 = local_788;
          bVar8 = true;
          if (*local_788 != 0) {
            bVar8 = local_788[8] * (long)(int)local_788[7] == 0;
          }
          if (bVar8) {
            local_76c = -100;
            local_880 = 1;
          }
          else {
            local_93c = *(int *)((long)local_788 + 0x2c);
            local_940 = (int)local_788[6];
            if (local_8a8 == 4) {
              for (local_944 = 0; local_944 < local_940; local_944 = local_944 + 1) {
                local_628 = &local_8f8;
                local_950 = (undefined8 *)((long)local_8f8 + (long)(local_93c * local_944 * 4) * 4);
                local_630 = &local_8f8;
                local_958 = (undefined8 *)
                            ((long)local_8f8 + (long)(local_93c * (local_944 * 4 + 1)) * 4);
                local_638 = &local_8f8;
                local_960 = (undefined8 *)
                            ((long)local_8f8 + (long)(local_93c * (local_944 * 4 + 2)) * 4);
                local_640 = &local_8f8;
                local_968 = (undefined8 *)
                            ((long)local_8f8 + (long)(local_93c * (local_944 * 4 + 3)) * 4);
                local_618 = local_788;
                local_61c = local_944;
                local_970 = (undefined8 *)
                            (*local_788 +
                            (long)*(int *)((long)local_788 + 0x2c) * (long)local_944 * local_788[2])
                ;
                for (local_974 = 0; local_974 + 3 < local_93c; local_974 = local_974 + 4) {
                  local_5d0 = local_950;
                  local_5d8 = local_958;
                  local_5e0 = local_960;
                  local_5e8 = local_968;
                  local_558 = (undefined4)*local_950;
                  uStack_554 = (undefined4)((ulong)*local_950 >> 0x20);
                  local_568 = (undefined4)*local_958;
                  uStack_564 = (undefined4)((ulong)*local_958 >> 0x20);
                  local_9f8 = CONCAT44(local_568,local_558);
                  uStack_9f0 = CONCAT44(uStack_564,uStack_554);
                  uVar13 = (undefined4)*local_960;
                  uVar14 = (undefined4)((ulong)*local_960 >> 0x20);
                  uVar11 = (undefined4)*local_968;
                  uVar12 = (undefined4)((ulong)*local_968 >> 0x20);
                  local_9d8 = CONCAT44(uVar11,uVar13);
                  uStack_9d0 = CONCAT44(uVar12,uVar14);
                  uStack_4d0 = (undefined4)local_950[1];
                  uStack_4cc = (undefined4)((ulong)local_950[1] >> 0x20);
                  uStack_4e0 = (undefined4)local_958[1];
                  uStack_4dc = (undefined4)((ulong)local_958[1] >> 0x20);
                  local_9e8 = CONCAT44(uStack_4e0,uStack_4d0);
                  uStack_9e0 = CONCAT44(uStack_4dc,uStack_4cc);
                  uStack_4f0 = (undefined4)local_960[1];
                  uStack_4ec = (undefined4)((ulong)local_960[1] >> 0x20);
                  uStack_500 = (undefined4)local_968[1];
                  uStack_4fc = (undefined4)((ulong)local_968[1] >> 0x20);
                  local_9c8 = CONCAT44(uStack_500,uStack_4f0);
                  uStack_9c0 = CONCAT44(uStack_4fc,uStack_4ec);
                  local_988 = CONCAT44(local_568,local_558);
                  uStack_980 = CONCAT44(uVar11,uVar13);
                  local_998 = CONCAT44(uStack_564,uStack_554);
                  uStack_990 = CONCAT44(uVar12,uVar14);
                  local_9a8 = CONCAT44(uStack_4e0,uStack_4d0);
                  uStack_9a0 = CONCAT44(uStack_500,uStack_4f0);
                  local_9b8 = CONCAT44(uStack_4dc,uStack_4cc);
                  uStack_9b0 = CONCAT44(uStack_4fc,uStack_4ec);
                  *local_970 = local_988;
                  local_970[1] = uStack_980;
                  local_970[2] = local_998;
                  local_970[3] = uStack_990;
                  local_970[4] = local_9a8;
                  local_970[5] = uStack_9a0;
                  local_970[6] = local_9b8;
                  local_970[7] = uStack_9b0;
                  local_950 = local_950 + 2;
                  local_958 = local_958 + 2;
                  local_960 = local_960 + 2;
                  local_968 = local_968 + 2;
                  local_970 = local_970 + 8;
                }
                for (; local_974 < local_93c; local_974 = local_974 + 1) {
                  *(undefined4 *)local_970 = *(undefined4 *)local_950;
                  *(undefined4 *)((long)local_970 + 4) = *(undefined4 *)local_958;
                  *(undefined4 *)(local_970 + 1) = *(undefined4 *)local_960;
                  *(undefined4 *)((long)local_970 + 0xc) = *(undefined4 *)local_968;
                  local_970 = local_970 + 2;
                  local_968 = (undefined8 *)((long)local_968 + 4);
                  local_960 = (undefined8 *)((long)local_960 + 4);
                  local_958 = (undefined8 *)((long)local_958 + 4);
                  local_950 = (undefined8 *)((long)local_950 + 4);
                }
              }
            }
            local_880 = 0;
          }
        }
        local_738 = &local_8f8;
        if (local_8f0 != (int *)0x0) {
          LOCK();
          iVar10 = *local_8f0;
          *local_8f0 = *local_8f0 + -1;
          UNLOCK();
          if (iVar10 == 1) {
            if (local_8d8 == (long *)0x0) {
              if (local_8f8 != (void *)0x0) {
                free(local_8f8);
              }
            }
            else {
              (**(code **)(*local_8d8 + 0x18))(local_8d8,local_8f8);
            }
          }
        }
        local_8f8 = (void *)0x0;
        local_8e8 = 0;
        local_8e0 = 0;
        local_8d0 = 0;
        local_8cc = 0;
        local_8c8 = 0;
        local_8c4 = 0;
        local_8c0 = 0;
        local_8b8 = 0;
        local_8f0 = (int *)0x0;
        if (local_880 != 0) {
          return local_76c;
        }
      }
      plVar7 = local_788;
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 3) ||
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 4)) {
        local_9fc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_a00 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_a04 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
        local_a08 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 3) {
          if (local_9fc == 0) {
            if (local_88c == 1) {
              local_de4 = *(int *)((long)local_780 + 0x2c) * local_794;
            }
            else {
              local_de4 = *(int *)((long)local_780 + 0x2c);
            }
            local_9fc = local_de4;
          }
          if (local_a00 == 0) {
            if (local_88c == 2) {
              local_de8 = (int)local_780[6] * local_794;
            }
            else {
              local_de8 = (int)local_780[6];
            }
            local_a00 = local_de8;
          }
          if (local_a08 == 0) {
            if (local_88c == 3) {
              local_dec = (int)local_780[7] * local_794;
            }
            else {
              local_dec = (int)local_780[7];
            }
            local_a08 = local_dec;
          }
          if (local_9fc == -1) {
            local_9fc = (int)((long)((ulong)(uint)((int)((long)local_89c / (long)local_a08) >> 0x1f)
                                     << 0x20 | (long)local_89c / (long)local_a08 & 0xffffffffU) /
                             (long)local_a00);
          }
          if (local_a00 == -1) {
            local_a00 = (int)((long)((ulong)(uint)((int)((long)local_89c / (long)local_a08) >> 0x1f)
                                     << 0x20 | (long)local_89c / (long)local_a08 & 0xffffffffU) /
                             (long)local_9fc);
          }
          if (local_a08 == -1) {
            local_a08 = (int)((long)((ulong)(uint)((int)((long)local_89c / (long)local_a00) >> 0x1f)
                                     << 0x20 | (long)local_89c / (long)local_a00 & 0xffffffffU) /
                             (long)local_9fc);
          }
          local_a04 = 1;
        }
        else {
          if (local_9fc == 0) {
            if (local_88c == 1) {
              local_df0 = *(int *)((long)local_780 + 0x2c) * local_794;
            }
            else {
              local_df0 = *(int *)((long)local_780 + 0x2c);
            }
            local_9fc = local_df0;
          }
          if (local_a00 == 0) {
            if (local_88c == 2) {
              local_df4 = (int)local_780[6] * local_794;
            }
            else {
              local_df4 = (int)local_780[6];
            }
            local_a00 = local_df4;
          }
          if (local_a04 == 0) {
            local_a04 = *(int *)((long)local_780 + 0x34);
          }
          if (local_a08 == 0) {
            if ((local_88c == 3) || (local_88c == 4)) {
              local_df8 = (int)local_780[7] * local_794;
            }
            else {
              local_df8 = (int)local_780[7];
            }
            local_a08 = local_df8;
          }
          if (local_9fc == -1) {
            uVar2 = (long)((ulong)(uint)((int)((long)local_89c / (long)local_a08) >> 0x1f) << 0x20 |
                          (long)local_89c / (long)local_a08 & 0xffffffffU) / (long)local_a04;
            local_9fc = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                             / (long)local_a00);
          }
          if (local_a00 == -1) {
            uVar2 = (long)((ulong)(uint)((int)((long)local_89c / (long)local_a08) >> 0x1f) << 0x20 |
                          (long)local_89c / (long)local_a08 & 0xffffffffU) / (long)local_a04;
            local_a00 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                             / (long)local_9fc);
          }
          if (local_a04 == -1) {
            uVar2 = (long)((ulong)(uint)((int)((long)local_89c / (long)local_a08) >> 0x1f) << 0x20 |
                          (long)local_89c / (long)local_a08 & 0xffffffffU) / (long)local_a00;
            local_a04 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                             / (long)local_9fc);
          }
          if (local_a08 == -1) {
            uVar2 = (long)((ulong)(uint)((int)((long)local_89c / (long)local_a04) >> 0x1f) << 0x20 |
                          (long)local_89c / (long)local_a04 & 0xffffffffU) / (long)local_a00;
            local_a08 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                             / (long)local_9fc);
          }
        }
        local_a0c = 1;
        if (((*(byte *)((long)local_790 + 0x27) & 1) != 0) && (local_a0c = 1, local_a08 % 4 == 0)) {
          local_a0c = 4;
        }
        local_a18 = (local_898 / (ulong)(long)local_794) * (long)local_a0c;
        if ((((local_88c == 3) || (local_88c == 4)) && ((int)local_780[7] * local_794 == local_a08))
           && (local_794 == local_a0c)) {
          local_6b8 = local_788;
          local_6c0 = local_780;
          if (local_788 != local_780) {
            if (local_780[1] != 0) {
              piVar1 = (int *)local_780[1];
              local_6c4 = 1;
              LOCK();
              local_6c8 = *piVar1;
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            if (local_788[1] != 0) {
              piVar1 = (int *)local_788[1];
              LOCK();
              iVar10 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (iVar10 == 1) {
                if (local_788[4] == 0) {
                  if ((void *)*local_788 != (void *)0x0) {
                    free((void *)*local_788);
                  }
                }
                else {
                  (**(code **)(*(long *)local_788[4] + 0x18))
                            ((long *)local_788[4],*local_788,local_898 % (ulong)(long)local_794);
                }
              }
            }
            *plVar7 = 0;
            plVar7[2] = 0;
            *(undefined4 *)(plVar7 + 3) = 0;
            *(undefined4 *)(plVar7 + 5) = 0;
            *(undefined4 *)((long)plVar7 + 0x2c) = 0;
            *(undefined4 *)(plVar7 + 6) = 0;
            *(undefined4 *)((long)plVar7 + 0x34) = 0;
            *(undefined4 *)(plVar7 + 7) = 0;
            plVar7[8] = 0;
            plVar7[1] = 0;
            *plVar7 = *local_6c0;
            plVar7[1] = local_6c0[1];
            plVar7[2] = local_6c0[2];
            *(int *)(plVar7 + 3) = (int)local_6c0[3];
            plVar7[4] = local_6c0[4];
            *(int *)(plVar7 + 5) = (int)local_6c0[5];
            *(undefined4 *)((long)plVar7 + 0x2c) = *(undefined4 *)((long)local_6c0 + 0x2c);
            *(int *)(plVar7 + 6) = (int)local_6c0[6];
            *(undefined4 *)((long)plVar7 + 0x34) = *(undefined4 *)((long)local_6c0 + 0x34);
            *(int *)(plVar7 + 7) = (int)local_6c0[7];
            plVar7[8] = local_6c0[8];
          }
          *(undefined4 *)(local_788 + 5) =
               *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
          *(int *)((long)local_788 + 0x2c) = local_9fc;
          *(int *)(local_788 + 6) = local_a00;
          *(int *)((long)local_788 + 0x34) = local_a04;
          return 0;
        }
        local_670 = &local_a60;
        local_678 = local_780;
        local_a60 = (void *)*local_780;
        local_a58 = (int *)local_780[1];
        local_a50 = local_780[2];
        local_a48 = (undefined4)local_780[3];
        local_a40 = (long *)local_780[4];
        local_a38 = (undefined4)local_780[5];
        local_a34 = *(undefined4 *)((long)local_780 + 0x2c);
        local_a30 = (undefined4)local_780[6];
        local_a2c = *(undefined4 *)((long)local_780 + 0x34);
        local_a28 = (int)local_780[7];
        local_a20 = local_780[8];
        if (local_a58 != (int *)0x0) {
          LOCK();
          *local_a58 = *local_a58 + 1;
          UNLOCK();
        }
        local_aa8 = *local_790;
        local_a98 = local_790[2];
        uStack_a90 = local_790[3];
        local_a88 = local_790[4];
        uStack_a80 = local_790[5];
        local_a78 = local_790[6];
        uStack_a70 = local_790[7];
        uStack_aa0 = local_790[2];
        flatten(in_stack_fffffffffffff090,in_stack_fffffffffffff088,
                (Option *)in_stack_fffffffffffff080);
        local_6f0 = &local_a60;
        if (local_a60 == (void *)0x0 || local_a20 * local_a28 == 0) {
          local_76c = -100;
          local_880 = 1;
        }
        else {
          iVar10 = (int)((ulong)in_stack_fffffffffffff060 >> 0x20);
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 3) {
            Mat::create(in_stack_fffffffffffff080,(int)((ulong)in_stack_fffffffffffff078 >> 0x20),
                        (int)in_stack_fffffffffffff078,
                        (int)((ulong)in_stack_fffffffffffff070 >> 0x20),in_stack_fffffffffffff068,
                        iVar10,(Allocator *)
                               CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0));
          }
          else {
            Mat::create(in_stack_fffffffffffff070,(int)(in_stack_fffffffffffff068 >> 0x20),
                        (int)in_stack_fffffffffffff068,iVar10,(int)in_stack_fffffffffffff060,
                        in_stack_fffffffffffff058,in_stack_fffffffffffff0d0,
                        (Allocator *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
          }
          local_6f8 = local_788;
          bVar8 = true;
          if (*local_788 != 0) {
            bVar8 = local_788[8] * (long)(int)local_788[7] == 0;
          }
          if (bVar8) {
            local_76c = -100;
            local_880 = 1;
          }
          else {
            local_aac = *(int *)((long)local_788 + 0x2c) * (int)local_788[6] *
                        *(int *)((long)local_788 + 0x34);
            if (local_a0c == 4) {
              for (local_ab0 = 0; local_ab0 < (int)local_788[7]; local_ab0 = local_ab0 + 1) {
                local_648 = &local_a60;
                local_ab8 = (undefined8 *)((long)local_a60 + (long)(local_aac * local_ab0 * 4) * 4);
                local_650 = &local_a60;
                local_ac0 = (undefined8 *)
                            ((long)local_a60 + (long)(local_aac * (local_ab0 * 4 + 1)) * 4);
                local_658 = &local_a60;
                local_ac8 = (undefined8 *)
                            ((long)local_a60 + (long)(local_aac * (local_ab0 * 4 + 2)) * 4);
                local_660 = &local_a60;
                local_ad0 = (undefined8 *)
                            ((long)local_a60 + (long)(local_aac * (local_ab0 * 4 + 3)) * 4);
                local_ad8 = (undefined8 *)
                            (*local_788 + local_788[8] * (long)local_ab0 * local_788[2]);
                local_b00 = local_788[4];
                local_728 = &local_b20;
                local_b20 = 0;
                local_b10 = 0;
                local_b08 = 0;
                local_af8 = 0;
                local_af4 = 0;
                local_af0 = 0;
                local_aec = 0;
                local_ae8 = 0;
                local_ae0 = 0;
                local_b18 = 0;
                for (local_b24 = 0; local_b24 + 3 < local_aac; local_b24 = local_b24 + 4) {
                  local_5f0 = local_ab8;
                  uVar3 = *local_ab8;
                  local_5f8 = local_ac0;
                  uVar4 = *local_ac0;
                  uStack_5a0 = local_ac0[1];
                  local_600 = local_ac8;
                  uVar5 = *local_ac8;
                  uStack_5b0 = local_ac8[1];
                  local_608 = local_ad0;
                  uVar6 = *local_ad0;
                  uStack_5c0 = local_ad0[1];
                  local_598._0_4_ = (undefined4)uVar3;
                  local_598._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                  local_5a8._0_4_ = (undefined4)uVar4;
                  local_5a8._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                  local_ba8 = CONCAT44((undefined4)local_5a8,(undefined4)local_598);
                  uStack_ba0 = CONCAT44(local_5a8._4_4_,local_598._4_4_);
                  local_5b8._0_4_ = (undefined4)uVar5;
                  local_5b8._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
                  local_5c8._0_4_ = (undefined4)uVar6;
                  local_5c8._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
                  local_b88 = CONCAT44((undefined4)local_5c8,(undefined4)local_5b8);
                  uStack_b80 = CONCAT44(local_5c8._4_4_,local_5b8._4_4_);
                  uStack_510 = (undefined4)local_ab8[1];
                  uStack_50c = (undefined4)((ulong)local_ab8[1] >> 0x20);
                  uStack_520 = (undefined4)uStack_5a0;
                  uStack_51c = (undefined4)((ulong)uStack_5a0 >> 0x20);
                  local_b98 = CONCAT44(uStack_520,uStack_510);
                  uStack_b90 = CONCAT44(uStack_51c,uStack_50c);
                  uStack_530 = (undefined4)uStack_5b0;
                  uStack_52c = (undefined4)((ulong)uStack_5b0 >> 0x20);
                  uStack_540 = (undefined4)uStack_5c0;
                  uStack_53c = (undefined4)((ulong)uStack_5c0 >> 0x20);
                  local_b78 = CONCAT44(uStack_540,uStack_530);
                  uStack_b70 = CONCAT44(uStack_53c,uStack_52c);
                  local_b38 = CONCAT44((undefined4)local_5a8,(undefined4)local_598);
                  uStack_b30 = CONCAT44((undefined4)local_5c8,(undefined4)local_5b8);
                  local_b48 = CONCAT44(local_5a8._4_4_,local_598._4_4_);
                  uStack_b40 = CONCAT44(local_5c8._4_4_,local_5b8._4_4_);
                  local_b58 = CONCAT44(uStack_520,uStack_510);
                  uStack_b50 = CONCAT44(uStack_540,uStack_530);
                  local_b68 = CONCAT44(uStack_51c,uStack_50c);
                  uStack_b60 = CONCAT44(uStack_53c,uStack_52c);
                  *local_ad8 = local_b38;
                  local_ad8[1] = uStack_b30;
                  local_ad8[2] = local_b48;
                  local_ad8[3] = uStack_b40;
                  local_ad8[4] = local_b58;
                  local_ad8[5] = uStack_b50;
                  local_ad8[6] = local_b68;
                  local_ad8[7] = uStack_b60;
                  local_ab8 = local_ab8 + 2;
                  local_ac0 = local_ac0 + 2;
                  local_ac8 = local_ac8 + 2;
                  local_ad0 = local_ad0 + 2;
                  local_ad8 = local_ad8 + 8;
                  local_5c8 = uVar6;
                  local_5b8 = uVar5;
                  local_5a8 = uVar4;
                  local_598 = uVar3;
                }
                for (; local_b24 < local_aac; local_b24 = local_b24 + 1) {
                  *(undefined4 *)local_ad8 = *(undefined4 *)local_ab8;
                  *(undefined4 *)((long)local_ad8 + 4) = *(undefined4 *)local_ac0;
                  *(undefined4 *)(local_ad8 + 1) = *(undefined4 *)local_ac8;
                  *(undefined4 *)((long)local_ad8 + 0xc) = *(undefined4 *)local_ad0;
                  local_ad8 = local_ad8 + 2;
                  local_ad0 = (undefined8 *)((long)local_ad0 + 4);
                  local_ac8 = (undefined8 *)((long)local_ac8 + 4);
                  local_ac0 = (undefined8 *)((long)local_ac0 + 4);
                  local_ab8 = (undefined8 *)((long)local_ab8 + 4);
                }
              }
            }
            if (local_a0c == 1) {
              for (local_bac = 0; local_bac < (int)local_788[7]; local_bac = local_bac + 1) {
                local_668 = &local_a60;
                local_bb8 = (undefined8 *)((long)local_a60 + (long)(local_aac * local_bac) * 4);
                local_bc0 = (undefined8 *)
                            (*local_788 + local_788[8] * (long)local_bac * local_788[2]);
                local_be8 = local_788[4];
                local_718 = &local_c08;
                local_c08 = 0;
                local_bf8 = 0;
                local_bf0 = 0;
                local_be0 = 0;
                local_bdc = 0;
                local_bd8 = 0;
                local_bd4 = 0;
                local_bd0 = 0;
                local_bc8 = 0;
                local_c00 = 0;
                for (local_c0c = 0; local_c0c + 3 < local_aac; local_c0c = local_c0c + 4) {
                  local_610 = local_bb8;
                  uVar3 = local_bb8[1];
                  *local_bc0 = *local_bb8;
                  local_bc0[1] = uVar3;
                  local_bb8 = local_bb8 + 2;
                  local_bc0 = local_bc0 + 2;
                }
                for (; local_c0c < local_aac; local_c0c = local_c0c + 1) {
                  *(undefined4 *)local_bc0 = *(undefined4 *)local_bb8;
                  local_bc0 = (undefined8 *)((long)local_bc0 + 4);
                  local_bb8 = (undefined8 *)((long)local_bb8 + 4);
                }
              }
            }
            local_880 = 0;
          }
        }
        ppvVar9 = &local_a60;
        if (local_a58 != (int *)0x0) {
          LOCK();
          iVar10 = *local_a58;
          *local_a58 = *local_a58 + -1;
          UNLOCK();
          if (iVar10 == 1) {
            local_708 = ppvVar9;
            if (local_a40 == (long *)0x0) {
              if (local_a60 != (void *)0x0) {
                free(local_a60);
              }
            }
            else {
              (**(code **)(*local_a40 + 0x18))(local_a40,local_a60);
            }
          }
        }
        *ppvVar9 = (void *)0x0;
        ppvVar9[2] = (void *)0x0;
        *(undefined4 *)(ppvVar9 + 3) = 0;
        *(undefined4 *)(ppvVar9 + 5) = 0;
        *(undefined4 *)((long)ppvVar9 + 0x2c) = 0;
        *(undefined4 *)(ppvVar9 + 6) = 0;
        *(undefined4 *)((long)ppvVar9 + 0x34) = 0;
        *(undefined4 *)(ppvVar9 + 7) = 0;
        ppvVar9[8] = (void *)0x0;
        ppvVar9[1] = (void *)0x0;
        if (local_880 != 0) {
          return local_76c;
        }
      }
      local_76c = 0;
    }
  }
  return local_76c;
}

Assistant:

int Reshape_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (permute == 1)
    {
        // TODO implement permute on-the-fly
        Option opt_pack = opt;
        opt_pack.blob_allocator = opt.workspace_allocator;

        Mat bottom_blob_unpacked;
        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);

        Mat top_blob_unpacked;
        int ret = Reshape::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
        if (ret != 0)
            return ret;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            // resolve dst_elempack
            int dims = top_blob_unpacked.dims;
#if __AVX512F__
            if (dims == 1) out_elempack = top_blob_unpacked.w % 16 == 0 ? 16 : top_blob_unpacked.w % 8 == 0 ? 8 : top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 16 == 0 ? 16 : top_blob_unpacked.h % 8 == 0 ? 8 : top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 16 == 0 ? 16 : top_blob_unpacked.c % 8 == 0 ? 8 : top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#elif __AVX__
            if (dims == 1) out_elempack = top_blob_unpacked.w % 8 == 0 ? 8 : top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 8 == 0 ? 8 : top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 8 == 0 ? 8 : top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#else
            if (dims == 1) out_elempack = top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);

        return 0;
    }

    if (ndim == 1)
    {
        // flatten
        flatten(bottom_blob, top_blob, opt);
        if (top_blob.empty())
            return -100;

        return 0;
    }

    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c * elempack;

    if (ndim == 2)
    {
        int _w = w;
        int _h = h;

        if (_w == 0)
            _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
        if (_h == 0)
            _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;

        if (_w == -1)
            _w = total / _h;
        if (_h == -1)
            _h = total / _w;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = _h % 16 == 0 ? 16 : _h % 8 == 0 ? 8 : _h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = _h % 8 == 0 ? 8 : _h % 4 == 0 ? 4 : 1;
#else
            out_elempack = _h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 2 && bottom_blob.h * elempack == _h && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (out_elempack == 1)
        {
            // flatten
            flatten(bottom_blob, top_blob, opt);
            if (top_blob.empty())
                return -100;

            top_blob.dims = 2;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.cstep = (size_t)_w * _h;
            top_blob.elemsize = out_elemsize;
            top_blob.elempack = out_elempack;

            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        top_blob.create(_w, _h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int outw = top_blob.w;
        int outh = top_blob.h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + outw * (i * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + outw * (i * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + outw * (i * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + outw * (i * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + outw * (i * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + outw * (i * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + outw * (i * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + outw * (i * 16 + 15);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 15 < outw; j += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 8 + 7);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 4 + 3);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (ndim == 3 || ndim == 4)
    {
        int _w = w;
        int _h = h;
        int _d = d;
        int _c = c;

        if (ndim == 3)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_c == 0)
                _c = dims == 3 ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _h;
            if (_h == -1)
                _h = total / _c / _w;
            if (_c == -1)
                _c = total / _h / _w;

            _d = 1;
        }
        else // if (ndim == 4)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_d == 0)
                _d = bottom_blob.d;
            if (_c == 0)
                _c = (dims == 3 || dims == 4) ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _d / _h;
            if (_h == -1)
                _h = total / _c / _d / _w;
            if (_d == -1)
                _d = total / _c / _h / _w;
            if (_c == -1)
                _c = total / _d / _h / _w;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = _c % 16 == 0 ? 16 : _c % 8 == 0 ? 8 : _c % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = _c % 8 == 0 ? 8 : _c % 4 == 0 ? 4 : 1;
#else
            out_elempack = _c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if ((dims == 3 || dims == 4) && bottom_blob.c * elempack == _c && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.dims = ndim;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.d = _d;
            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        if (ndim == 3)
        {
            top_blob.create(_w, _h, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        else // if (ndim == 4)
        {
            top_blob.create(_w, _h, _d, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        if (top_blob.empty())
            return -100;

        int size = top_blob.w * top_blob.h * top_blob.d;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + size * (q * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + size * (q * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + size * (q * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + size * (q * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + size * (q * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + size * (q * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + size * (q * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + size * (q * 16 + 15);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 8 + 7);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 4 + 3);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr = (const float*)bottom_blob_flattened + size * q;
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i + 3 < size; i += 4)
                {
                    __m128 _v = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(outptr, _v);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}